

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

container_t *
container_from_run_range(run_container_t *run,uint32_t min,uint32_t max,uint8_t *typecode_after)

{
  uint64_t *words;
  int iVar1;
  array_container_t *bits;
  array_container_t *paVar2;
  int32_t i;
  long lVar3;
  uint32_t lenminusone;
  int iVar4;
  
  bits = (array_container_t *)bitset_container_create();
  *typecode_after = '\x01';
  iVar4 = 0;
  for (lVar3 = 0; lVar3 < run->n_runs; lVar3 = lVar3 + 1) {
    bitset_set_lenrange((uint64_t *)bits->array,(uint)run->runs[lVar3].value,
                        (uint)run->runs[lVar3].length);
    iVar4 = iVar4 + (uint)run->runs[lVar3].length + 1;
  }
  lenminusone = max - min;
  words = (uint64_t *)bits->array;
  iVar1 = bitset_lenrange_cardinality(words,min,lenminusone);
  iVar4 = ((iVar4 + lenminusone) - iVar1) + 1;
  bitset_set_lenrange(words,min,lenminusone);
  bits->cardinality = iVar4;
  if (iVar4 < 0x1001) {
    paVar2 = array_container_from_bitset((bitset_container_t *)bits);
    *typecode_after = '\x02';
    bitset_container_free((bitset_container_t *)bits);
    bits = paVar2;
  }
  return bits;
}

Assistant:

container_t *container_from_run_range(
    const run_container_t *run,
    uint32_t min, uint32_t max, uint8_t *typecode_after
){
    // We expect most of the time to end up with a bitset container
    bitset_container_t *bitset = bitset_container_create();
    *typecode_after = BITSET_CONTAINER_TYPE;
    int32_t union_cardinality = 0;
    for (int32_t i = 0; i < run->n_runs; ++i) {
        uint32_t rle_min = run->runs[i].value;
        uint32_t rle_max = rle_min + run->runs[i].length;
        bitset_set_lenrange(bitset->words, rle_min, rle_max - rle_min);
        union_cardinality += run->runs[i].length + 1;
    }
    union_cardinality += max - min + 1;
    union_cardinality -= bitset_lenrange_cardinality(bitset->words, min, max-min);
    bitset_set_lenrange(bitset->words, min, max - min);
    bitset->cardinality = union_cardinality;
    if(bitset->cardinality <= DEFAULT_MAX_SIZE) {
        // we need to convert to an array container
        array_container_t * array = array_container_from_bitset(bitset);
        *typecode_after = ARRAY_CONTAINER_TYPE;
        bitset_container_free(bitset);
        return array;
    }
    return bitset;
}